

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O0

void __thiscall Emulator::init_sdl(Emulator *this,char *game_name)

{
  int iVar1;
  SDL_AudioDeviceID SVar2;
  SDL_Window *pSVar3;
  SDL_Renderer *pSVar4;
  SDL_Texture *pSVar5;
  undefined8 uVar6;
  char local_38 [8];
  char window_name [32];
  char *game_name_local;
  Emulator *this_local;
  
  window_name._24_8_ = game_name;
  snprintf(local_38,0x20,"CHIP-8 Emu: %s",game_name);
  memset(&this->sdl,0,0x50);
  iVar1 = SDL_Init(0x30);
  if (iVar1 < 0) {
    error_sdl("SDL_Init");
  }
  pSVar3 = (SDL_Window *)SDL_CreateWindow(local_38,0x1fff0000,0x1fff0000,0x500,0x280,4);
  (this->sdl).window = pSVar3;
  if ((this->sdl).window == (SDL_Window *)0x0) {
    error_sdl("SDL_CreateWindow");
  }
  pSVar4 = (SDL_Renderer *)SDL_CreateRenderer((this->sdl).window,0xffffffff,0);
  (this->sdl).renderer = pSVar4;
  SDL_RenderSetLogicalSize((this->sdl).renderer,0x500,0x280);
  pSVar5 = (SDL_Texture *)SDL_CreateTexture((this->sdl).renderer,0x16362004,1,0x40,0x20);
  (this->sdl).texture = pSVar5;
  uVar6 = SDL_RWFromFile("beep.wav","rb");
  SDL_LoadWAV_RW(uVar6,1,&(this->sdl).spec,&(this->sdl).audio_buf,&(this->sdl).audio_len);
  if (((this->sdl).audio_buf == (uint8_t *)0x0) || ((this->sdl).audio_len == 0)) {
    error_sdl("SDL_LoadWAV");
  }
  SVar2 = SDL_OpenAudioDevice(0,0,&(this->sdl).spec);
  (this->sdl).audio_dev = SVar2;
  if ((this->sdl).audio_dev == 0) {
    error_sdl("SDL_OpenAudioDevice");
  }
  SDL_PauseAudioDevice((this->sdl).audio_dev,0);
  return;
}

Assistant:

void Emulator::init_sdl(const char* game_name){
	// Create window name
	char window_name[32];
	snprintf(window_name, sizeof(window_name), "CHIP-8 Emu: %s", game_name);

	// Init SDL
	memset(&sdl, 0, sizeof(sdl));
	if (SDL_Init(SDL_INIT_VIDEO | SDL_INIT_AUDIO) < 0)
		error_sdl("SDL_Init");

	// Create window
	sdl.window = SDL_CreateWindow(window_name, SDL_WINDOWPOS_UNDEFINED, 
	                              SDL_WINDOWPOS_UNDEFINED, FRAMEBUF_W*20, 
	                              FRAMEBUF_H*20, SDL_WINDOW_SHOWN);
	if (sdl.window == NULL)
		error_sdl("SDL_CreateWindow");

	// Create renderer
	sdl.renderer = SDL_CreateRenderer(sdl.window, -1, 0);
	SDL_RenderSetLogicalSize(sdl.renderer, FRAMEBUF_W*20, FRAMEBUF_H*20);

	// Create texture that stores frame buffer
	sdl.texture = SDL_CreateTexture(sdl.renderer, SDL_PIXELFORMAT_ARGB8888,
	                                SDL_TEXTUREACCESS_STREAMING, FRAMEBUF_W,
	                                FRAMEBUF_H);

	// Load audio
	SDL_LoadWAV("beep.wav", &sdl.spec, &sdl.audio_buf, &sdl.audio_len);
	if (!sdl.audio_buf || !sdl.audio_len)
		error_sdl("SDL_LoadWAV");

	sdl.audio_dev = SDL_OpenAudioDevice(NULL, 0, &sdl.spec, NULL, 0);
	if (!sdl.audio_dev)
		error_sdl("SDL_OpenAudioDevice");

	SDL_PauseAudioDevice(sdl.audio_dev, 0);
}